

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::pipeline::anon_unknown_0::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,Context *context,
          VkDeviceSize size,VkBufferUsageFlags usage,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  Allocation *pAVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar2;
  deUint32 queueFamilyIndex;
  VkBufferCreateInfo vertexBufferParams;
  ulong in_stack_ffffffffffffff58;
  deUint32 local_84;
  VkMemoryRequirements local_80;
  VkBufferCreateInfo local_68;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_84 = Context::getUniversalQueueFamilyIndex(context);
  local_68.pQueueFamilyIndices = &local_84;
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.queueFamilyIndexCount = 1;
  local_68.size = size;
  local_68.usage = usage;
  ::vk::createBuffer(__return_storage_ptr__,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
  pAVar2 = Context::getDefaultAllocator(context);
  ::vk::getBufferMemoryRequirements
            (&local_80,vk,device,
             (VkBuffer)
             (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
             m_internal);
  (*pAVar2->_vptr_Allocator[3])(&stack0xffffffffffffff60,pAVar2,&local_80,1);
  data._8_8_ = 0;
  data.ptr = (Allocation *)in_stack_ffffffffffffff58;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &stack0xffffffffffffff60);
  pAVar1 = (pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.
           ptr;
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data
                      .object.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, (*pAlloc)->getMemory(), (*pAlloc)->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x1ca);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> createBufferAndBindMemory (Context& context, VkDeviceSize size, VkBufferUsageFlags usage, de::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&  vk               = context.getDeviceInterface();
	const VkDevice          vkDevice         = context.getDevice();
	const deUint32          queueFamilyIndex = context.getUniversalQueueFamilyIndex();

	const VkBufferCreateInfo vertexBufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,       // VkStructureType      sType;
		DE_NULL,                                    // const void*          pNext;
		0u,                                         // VkBufferCreateFlags  flags;
		size,                                       // VkDeviceSize         size;
		usage,                                      // VkBufferUsageFlags   usage;
		VK_SHARING_MODE_EXCLUSIVE,                  // VkSharingMode        sharingMode;
		1u,                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex                           // const deUint32*      pQueueFamilyIndices;
	};

	Move<VkBuffer> vertexBuffer = createBuffer(vk, vkDevice, &vertexBufferParams);

	*pAlloc = context.getDefaultAllocator().allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, (*pAlloc)->getMemory(), (*pAlloc)->getOffset()));

	return vertexBuffer;
}